

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::multiply(bigint *this,uint64_t value)

{
  uint *puVar1;
  size_t sVar2;
  undefined8 in_RAX;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uStack_28;
  
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar6 = 0;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    uVar4 = (ulong)puVar1[sVar3];
    uVar5 = (uVar6 & 0xffffffff) + (value & 0xffffffff) * uVar4;
    puVar1[sVar3] = (uint)uVar5;
    uVar6 = (uVar6 >> 0x20) + uVar4 * (value >> 0x20) + (uVar5 >> 0x20);
  }
  uStack_28 = in_RAX;
  for (; uVar6 != 0; uVar6 = uVar6 >> 0x20) {
    uStack_28 = CONCAT44((int)uVar6,(undefined4)uStack_28);
    buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,(uint *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

void multiply(uint64_t value) {
    const bigit mask = ~bigit(0);
    const double_bigit lower = value & mask;
    const double_bigit upper = value >> bigit_bits;
    double_bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * lower + (carry & mask);
      carry =
          bigits_[i] * upper + (result >> bigit_bits) + (carry >> bigit_bits);
      bigits_[i] = static_cast<bigit>(result);
    }
    while (carry != 0) {
      bigits_.push_back(carry & mask);
      carry >>= bigit_bits;
    }
  }